

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O1

Gia_Man_t * Abc_NtkClpGia(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  char *pcVar2;
  void *pvVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  long *plVar6;
  uint uVar7;
  Gia_Man_t *p;
  size_t sVar8;
  char *pcVar9;
  long lVar10;
  Abc_Obj_t *pAVar11;
  Gia_Obj_t *pGVar12;
  Vec_Ptr_t *pVVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcCollapse.c"
                  ,0x243,"Gia_Man_t *Abc_NtkClpGia(Abc_Ntk_t *)");
  }
  p = Gia_ManStart(1000);
  pcVar2 = pNtk->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p->pName = pcVar9;
  pcVar2 = pNtk->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p->pSpec = pcVar9;
  pVVar13 = pNtk->vObjs;
  if (0 < pVVar13->nSize) {
    lVar10 = 0;
    do {
      if (pVVar13->pArray[lVar10] != (void *)0x0) {
        *(undefined4 *)((long)pVVar13->pArray[lVar10] + 0x40) = 0xffffffff;
      }
      lVar10 = lVar10 + 1;
      pVVar13 = pNtk->vObjs;
    } while (lVar10 < pVVar13->nSize);
  }
  pAVar11 = Abc_AigConst1(pNtk);
  (pAVar11->field_6).iTemp = 1;
  pVVar13 = pNtk->vCis;
  if (0 < pVVar13->nSize) {
    lVar10 = 0;
    do {
      pvVar3 = pVVar13->pArray[lVar10];
      pGVar12 = Gia_ManAppendObj(p);
      uVar4 = *(ulong *)pGVar12;
      *(ulong *)pGVar12 = uVar4 | 0x9fffffff;
      *(ulong *)pGVar12 =
           uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar5 = p->pObjs;
      if ((pGVar12 < pGVar5) || (pGVar5 + p->nObjs <= pGVar12)) goto LAB_0029f8c4;
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p->pObjs;
      if ((pGVar12 < pGVar5) || (pGVar5 + p->nObjs <= pGVar12)) goto LAB_0029f8c4;
      *(int *)((long)pvVar3 + 0x40) = (int)((ulong)((long)pGVar12 - (long)pGVar5) >> 2) * 0x55555556
      ;
      lVar10 = lVar10 + 1;
      pVVar13 = pNtk->vCis;
    } while (lVar10 < pVVar13->nSize);
  }
  pVVar13 = pNtk->vCos;
  if (0 < pVVar13->nSize) {
    lVar10 = 0;
    do {
      plVar6 = (long *)pVVar13->pArray[lVar10];
      uVar7 = Abc_NtkClpGia_rec(p,*(Abc_Obj_t **)
                                   (*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                   (long)*(int *)plVar6[4] * 8));
      if ((int)uVar7 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar15 = uVar7 >> 1;
      if (p->nObjs <= (int)uVar15) {
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      if ((~*(uint *)(p->pObjs + uVar15) & 0x1fffffff) != 0 && (int)*(uint *)(p->pObjs + uVar15) < 0
         ) {
        __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      uVar1 = *(uint *)((long)plVar6 + 0x14);
      pGVar12 = Gia_ManAppendObj(p);
      uVar4 = *(ulong *)pGVar12;
      *(ulong *)pGVar12 = uVar4 | 0x80000000;
      pGVar5 = p->pObjs;
      if ((pGVar12 < pGVar5) || (pGVar5 + p->nObjs <= pGVar12)) {
LAB_0029f8c4:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar14 = (ulong)(((uint)((int)pGVar12 - (int)pGVar5) >> 2) * -0x55555555 - uVar15 & 0x1fffffff
                      );
      uVar16 = (ulong)(((uVar1 >> 10 ^ uVar7) & 1) << 0x1d);
      *(ulong *)pGVar12 = uVar16 | uVar4 & 0xffffffffc0000000 | 0x80000000 | uVar14;
      *(ulong *)pGVar12 =
           uVar16 | uVar4 & 0xe0000000c0000000 | 0x80000000 | uVar14 |
           (ulong)(p->vCos->nSize & 0x1fffffff) << 0x20;
      pGVar5 = p->pObjs;
      if ((pGVar12 < pGVar5) || (pGVar5 + p->nObjs <= pGVar12)) goto LAB_0029f8c4;
      Vec_IntPush(p->vCos,(int)((ulong)((long)pGVar12 - (long)pGVar5) >> 2) * -0x55555555);
      if (p->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p,pGVar12 + -(ulong)((uint)*(undefined8 *)pGVar12 & 0x1fffffff),pGVar12);
      }
      if ((pGVar12 < p->pObjs) || (p->pObjs + p->nObjs <= pGVar12)) goto LAB_0029f8c4;
      lVar10 = lVar10 + 1;
      pVVar13 = pNtk->vCos;
    } while (lVar10 < pVVar13->nSize);
  }
  return p;
}

Assistant:

Gia_Man_t * Abc_NtkClpGia( Abc_Ntk_t * pNtk )
{
    int i, iLit;
    Gia_Man_t * pNew;
    Abc_Obj_t * pNode;
    assert( Abc_NtkIsStrash(pNtk) );
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( pNtk->pName );
    pNew->pSpec = Abc_UtilStrsav( pNtk->pSpec );
    Abc_NtkForEachObj( pNtk, pNode, i )
        pNode->iTemp = -1;
    Abc_AigConst1(pNtk)->iTemp = 1;
    Abc_NtkForEachCi( pNtk, pNode, i )
        pNode->iTemp = Gia_ManAppendCi(pNew);
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        iLit = Abc_NtkClpGia_rec( pNew, Abc_ObjFanin0(pNode) );
        iLit = Abc_LitNotCond( iLit, Abc_ObjFaninC0(pNode) );
        Gia_ManAppendCo( pNew, iLit );
    }
    return pNew;
}